

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathsimplifier.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_e93b21::PathSimplifier::intersectNodes
          (PathSimplifier *this,
          QDataBuffer<(anonymous_namespace)::PathSimplifier::Element_*> *elements,
          BVHNode *elementNode,BVHNode *treeNode)

{
  ushort uVar1;
  uint uVar2;
  Element *treeNode_00;
  Element *element;
  QPoint *pQVar3;
  QDataBuffer<QPoint> *this_00;
  undefined4 uVar4;
  undefined4 uVar5;
  bool bVar6;
  bool bVar7;
  pair<int,_int> pVar8;
  pair<int,_int> pVar9;
  byte bVar10;
  undefined1 *puVar11;
  quint32 *pqVar12;
  long lVar13;
  Fraction axis;
  long in_FS_OFFSET;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  int iVar17;
  QPoint local_c0;
  undefined1 local_b8 [32];
  undefined1 *puStack_98;
  undefined1 *local_90;
  undefined1 *puStack_88;
  undefined1 *local_80;
  undefined1 *puStack_78;
  undefined1 *local_70;
  undefined1 *puStack_68;
  undefined1 *local_60;
  undefined1 *puStack_58;
  undefined1 *local_50;
  undefined1 *puStack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  while( true ) {
    if (((((treeNode->maximum).xp.m_i <= (elementNode->minimum).xp.m_i) ||
         ((treeNode->maximum).yp.m_i <= (elementNode->minimum).yp.m_i)) ||
        ((elementNode->maximum).xp.m_i <= (treeNode->minimum).xp.m_i)) ||
       ((elementNode->maximum).yp.m_i <= (treeNode->minimum).yp.m_i)) goto LAB_003a7ed6;
    treeNode_00 = (treeNode->field_3).element;
    if (treeNode->type == Leaf) break;
    bVar6 = intersectNodes(this,elements,elementNode,(BVHNode *)treeNode_00);
    if (bVar6) {
      bVar6 = true;
      goto LAB_003a7ed8;
    }
    treeNode = treeNode->right;
  }
  element = (elementNode->field_3).element;
  uVar1 = *(ushort *)&treeNode_00->field_0x38;
  if (treeNode_00 != element && (uVar1 >> 8 & 1) != 0) {
    bVar10 = (byte)uVar1;
    if ((byte)*(ushort *)&element->field_0x38 != bVar10) goto LAB_003a7fcc;
    pQVar3 = this->m_points->buffer;
    pqVar12 = element->indices;
    bVar6 = true;
    for (lVar13 = 0; (ulong)bVar10 + 1 != lVar13; lVar13 = lVar13 + 1) {
      uVar2 = ((Representation *)treeNode_00->indices)[lVar13].m_i;
      iVar16 = -(uint)(pQVar3[pqVar12[lVar13]].xp.m_i == pQVar3[uVar2].xp.m_i);
      iVar17 = -(uint)(pQVar3[pqVar12[lVar13]].yp.m_i == pQVar3[uVar2].yp.m_i);
      auVar14._4_4_ = iVar16;
      auVar14._0_4_ = iVar16;
      auVar14._8_4_ = iVar17;
      auVar14._12_4_ = iVar17;
      iVar16 = movmskpd(uVar2,auVar14);
      bVar6 = (bool)(bVar6 & iVar16 == 3);
    }
    bVar7 = true;
    for (lVar13 = (ulong)bVar10 + 2; lVar13 != 1; lVar13 = lVar13 + -1) {
      uVar2 = ((Representation *)treeNode_00->indices)[lVar13 + -2].m_i;
      iVar16 = -(uint)(pQVar3[*pqVar12].xp.m_i == pQVar3[uVar2].xp.m_i);
      iVar17 = -(uint)(pQVar3[*pqVar12].yp.m_i == pQVar3[uVar2].yp.m_i);
      auVar15._4_4_ = iVar16;
      auVar15._0_4_ = iVar16;
      auVar15._8_4_ = iVar17;
      auVar15._12_4_ = iVar17;
      iVar16 = movmskpd(uVar2,auVar15);
      bVar7 = (bool)(bVar7 & iVar16 == 3);
      pqVar12 = pqVar12 + 1;
    }
    if (!bVar6 && !bVar7) {
LAB_003a7fcc:
      if (((uVar1 & 0xff) != 1) || ((*(ushort *)&element->field_0x38 & 0xff) != 1)) {
        local_b8._16_8_ = (long)local_b8 + 0x18;
        local_50 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_48 = &DAT_aaaaaaaaaaaaaaaa;
        local_60 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_58 = &DAT_aaaaaaaaaaaaaaaa;
        local_70 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_68 = &DAT_aaaaaaaaaaaaaaaa;
        local_80 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_78 = &DAT_aaaaaaaaaaaaaaaa;
        local_90 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_88 = &DAT_aaaaaaaaaaaaaaaa;
        local_b8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        puStack_98 = &DAT_aaaaaaaaaaaaaaaa;
        local_b8._0_8_ = (undefined1 *)0xc;
        local_b8._8_8_ = (undefined1 *)0x0;
        appendSeparatingAxes(this,(QVarLengthArray<QPoint,_12LL> *)local_b8,element);
        appendSeparatingAxes
                  (this,(QVarLengthArray<QPoint,_12LL> *)local_b8,(treeNode->field_3).element);
        puVar11 = (undefined1 *)0x0;
        if (0 < (long)local_b8._8_8_) {
          puVar11 = (undefined1 *)local_b8._8_8_;
        }
        puVar11 = puVar11 + 1;
        axis = (Fraction)local_b8._16_8_;
        while (puVar11 = puVar11 + -1, puVar11 != (undefined1 *)0x0) {
          pVar8 = calculateSeparatingAxisRange(this,(QPoint *)axis,(elementNode->field_3).element);
          pVar9 = calculateSeparatingAxisRange(this,(QPoint *)axis,(treeNode->field_3).element);
          bVar6 = false;
          if ((pVar9.second <= pVar8.first) ||
             (axis = (Fraction)((long)axis + 8), bVar6 = false, pVar8.second <= pVar9.first))
          goto LAB_003a821c;
        }
        if ((treeNode_00->field_0x38 & 0xfe) != 0) {
          splitCurve(this,elements,treeNode);
        }
        if ((element->field_0x38 & 0xfe) == 0) {
          bVar7 = intersectNodes(this,elements,elementNode,(BVHNode *)(treeNode->field_3).element);
          bVar6 = true;
          if (!bVar7) {
            bVar6 = intersectNodes(this,elements,elementNode,treeNode->right);
          }
        }
        else {
          splitCurve(this,elements,elementNode);
          bVar6 = true;
        }
LAB_003a821c:
        QVarLengthArray<QPoint,_12LL>::~QVarLengthArray((QVarLengthArray<QPoint,_12LL> *)local_b8);
        goto LAB_003a7ed8;
      }
      this_00 = this->m_points;
      pQVar3 = this_00->buffer;
      local_b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      intersectionPoint((IntersectionPoint *)local_b8,pQVar3 + element->indices[0],
                        pQVar3 + element->indices[1],
                        pQVar3 + (uint)((Representation *)treeNode_00->indices)->m_i,
                        pQVar3 + *(uint *)((Representation *)treeNode_00->indices + 1));
      if (local_b8._20_4_ != 0 && local_b8._8_4_ != 0) {
        uVar4 = local_b8._4_4_;
        local_c0.xp.m_i =
             (local_b8._0_4_ + 1) - (uint)((uint)(local_b8._4_4_ * 2) < (uint)local_b8._8_4_);
        uVar5 = local_b8._16_4_;
        local_c0.yp.m_i =
             (local_b8._12_4_ + 1) - (uint)((uint)(local_b8._16_4_ * 2) < (uint)local_b8._20_4_);
        QDataBuffer<QPoint>::add(this_00,&local_c0);
        splitLineAt(this,elements,treeNode,(int)this->m_points->siz - 1,uVar4 != 0 || uVar5 != 0);
        bVar6 = splitLineAt(this,elements,elementNode,(int)this->m_points->siz - 1,false);
        goto LAB_003a7ed8;
      }
    }
  }
LAB_003a7ed6:
  bVar6 = false;
LAB_003a7ed8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

bool PathSimplifier::intersectNodes(QDataBuffer<Element *> &elements, BVHNode *elementNode,
                                    BVHNode *treeNode)
{
    if (elementNode->minimum.x() >= treeNode->maximum.x()
        || elementNode->minimum.y() >= treeNode->maximum.y()
        || elementNode->maximum.x() <= treeNode->minimum.x()
        || elementNode->maximum.y() <= treeNode->minimum.y())
    {
        return false;
    }

    Q_ASSERT(elementNode->type == BVHNode::Leaf);
    Element *element = elementNode->element;
    Q_ASSERT(!element->processed);

    if (treeNode->type == BVHNode::Leaf) {
        Element *nodeElement = treeNode->element;
        if (!nodeElement->processed)
            return false;

        if (treeNode->element == elementNode->element)
            return false;

        if (equalElements(treeNode->element, elementNode->element))
            return false; // element doesn't split itself.

        if (element->degree == Element::Line && nodeElement->degree == Element::Line) {
            const QPoint &u1 = m_points->at(element->indices[0]);
            const QPoint &u2 = m_points->at(element->indices[1]);
            const QPoint &v1 = m_points->at(nodeElement->indices[0]);
            const QPoint &v2 = m_points->at(nodeElement->indices[1]);
            IntersectionPoint intersection = intersectionPoint(u1, u2, v1, v2);
            if (!intersection.isValid())
                return false;

            Q_ASSERT(intersection.x.integer >= qMin(u1.x(), u2.x()));
            Q_ASSERT(intersection.y.integer >= qMin(u1.y(), u2.y()));
            Q_ASSERT(intersection.x.integer >= qMin(v1.x(), v2.x()));
            Q_ASSERT(intersection.y.integer >= qMin(v1.y(), v2.y()));

            Q_ASSERT(intersection.x.integer <= qMax(u1.x(), u2.x()));
            Q_ASSERT(intersection.y.integer <= qMax(u1.y(), u2.y()));
            Q_ASSERT(intersection.x.integer <= qMax(v1.x(), v2.x()));
            Q_ASSERT(intersection.y.integer <= qMax(v1.y(), v2.y()));

            m_points->add(intersection.round());
            splitLineAt(elements, treeNode, m_points->size() - 1, !intersection.isAccurate());
            return splitLineAt(elements, elementNode, m_points->size() - 1, false);
        } else {
            QVarLengthArray<QPoint, 12> axes;
            appendSeparatingAxes(axes, elementNode->element);
            appendSeparatingAxes(axes, treeNode->element);
            for (int i = 0; i < axes.size(); ++i) {
                std::pair<int, int> range1 = calculateSeparatingAxisRange(axes.at(i), elementNode->element);
                std::pair<int, int> range2 = calculateSeparatingAxisRange(axes.at(i), treeNode->element);
                if (range1.first >= range2.second || range1.second <= range2.first) {
                    return false; // Separating axis found.
                }
            }
            // Bounding areas overlap.
            if (nodeElement->degree > Element::Line)
                splitCurve(elements, treeNode);
            if (element->degree > Element::Line) {
                splitCurve(elements, elementNode);
            } else {
                // The element was not split, so it can be processed further.
                if (intersectNodes(elements, elementNode, treeNode->left))
                    return true;
                if (intersectNodes(elements, elementNode, treeNode->right))
                    return true;
                return false;
            }
            return true;
        }
    } else {
        if (intersectNodes(elements, elementNode, treeNode->left))
            return true;
        if (intersectNodes(elements, elementNode, treeNode->right))
            return true;
        return false;
    }
}